

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harness.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  UnitTest *this;
  TestEventListeners *this_00;
  TestEventListener *pTVar4;
  TestEventListener *listener;
  _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::__0> *this_01;
  char **__it;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::__0> *this_02;
  int argc_local;
  
  __it = argv;
  argc_local = argc;
  testing::InitGoogleMock(&argc_local,argv);
  lVar3 = (long)argc_local;
  if (1 < lVar3) {
    uVar5 = lVar3 * 8 - 8;
    this_01 = (_Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::__0> *)(argv + 4);
    for (uVar7 = uVar5 >> 5; this_02 = this_01 + -0x18, 0 < (long)uVar7; uVar7 = uVar7 - 1) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                        (this_02,__it);
      if (bVar1) goto LAB_0012386a;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                        (this_01 + -0x10,__it);
      this_02 = this_01 + -0x10;
      if (bVar1) goto LAB_0012386a;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                        (this_01 + -8,__it);
      this_02 = this_01 + -8;
      if ((bVar1) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                            (this_01,__it), this_02 = this_01, bVar1)) goto LAB_0012386a;
      this_01 = this_01 + 0x20;
      uVar5 = uVar5 - 0x20;
    }
    lVar6 = (long)uVar5 >> 3;
    if (lVar6 == 1) {
LAB_001238e5:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                        (this_02,__it);
      if (!bVar1) goto LAB_0012386f;
    }
    else if (lVar6 == 3) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                        (this_02,__it);
      if (!bVar1) {
        this_02 = this_01 + -0x10;
        goto LAB_001238d5;
      }
    }
    else {
      if (lVar6 != 2) goto LAB_0012386f;
LAB_001238d5:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::$_0>::operator()
                        (this_02,__it);
      if (!bVar1) {
        this_02 = this_02 + 8;
        goto LAB_001238e5;
      }
    }
LAB_0012386a:
    if (this_02 !=
        (_Iter_pred<(anonymous_namespace)::loud_mode_enabled(int,char**)::__0> *)(argv + lVar3))
    goto LAB_001238af;
  }
LAB_0012386f:
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::listeners(this);
  pTVar4 = testing::TestEventListeners::Release(this_00,this_00->default_result_printer_);
  listener = (TestEventListener *)operator_new(0x10);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__quiet_event_listener_0018ae98;
  listener[1]._vptr_TestEventListener = (_func_int **)pTVar4;
  testing::TestEventListeners::Append(this_00,listener);
LAB_001238af:
  iVar2 = RUN_ALL_TESTS();
  return iVar2;
}

Assistant:

int main (int argc, char ** argv) {
    PSTORE_TRY {
#if PSTORE_IS_INSIDE_LLVM
        llvm::sys::PrintStackTraceOnErrorSignal (argv[0], true /* Disable crash reporting */);
#endif

        // Since Google Mock depends on Google Test, InitGoogleMock() is
        // also responsible for initializing Google Test. Therefore there's
        // no need for calling testing::InitGoogleTest() separately.
        testing::InitGoogleMock (&argc, argv);

        // Unless the user enables "loud mode" by passing the appropriate switch, we silence much of
        // google test/mock's output so that we only see detailed information about tests that fail.
        if (!loud_mode_enabled (argc, argv)) {
            // Remove the default listener
            testing::TestEventListeners & listeners =
                testing::UnitTest::GetInstance ()->listeners ();
            testing::TestEventListener * const default_printer =
                listeners.Release (listeners.default_result_printer ());

            // Add our listener. By default everything is on (as when using the default listener)
            // but here we turn everything off so we only see the 3 lines for the result (plus any
            // failures at the end), like:
            //
            // [==========] Running 149 tests from 53 test cases.
            // [==========] 149 tests from 53 test cases ran. (1 ms total)
            // [  PASSED  ] 149 tests.

            listeners.Append (new quiet_event_listener (default_printer));
        }

#if defined(_WIN32)
        // Disable all of the possible ways Windows conspires to make automated
        // testing impossible.
        ::SetErrorMode (SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#    if defined(_MSC_VER)
        ::_set_error_mode (_OUT_TO_STDERR);
        _CrtSetReportMode (_CRT_WARN, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_WARN, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ERROR, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#    endif
#endif
        return RUN_ALL_TESTS ();
    }